

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callSetup,void *mem)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  uint nvec;
  N_Vector z;
  N_Vector x;
  N_Vector z_00;
  int *piVar4;
  N_Vector p_Var5;
  N_Vector y;
  long lVar6;
  long lVar7;
  N_Vector *Y;
  realtype *c;
  N_Vector *X;
  double *pdVar8;
  realtype *dotprods;
  N_Vector z_01;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long *plVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  realtype rVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  auVar26._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar26._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar26._8_4_ = -(uint)(ycor == (N_Vector)0x0);
  auVar26._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar15 = movmskps((int)w,auVar26);
  iVar11 = -0x385;
  if (((iVar15 == 0 && mem != (void *)0x0) && (plVar18 = (long *)NLS->content, *plVar18 != 0)) &&
     (plVar18[1] != 0)) {
    z = (N_Vector)plVar18[0xd];
    x = (N_Vector)plVar18[0xe];
    z_00 = (N_Vector)plVar18[0x11];
    *(undefined4 *)(plVar18 + 0x12) = 0;
    plVar18[0x13] = 0;
    plVar18[0x14] = 0;
    iVar15 = 0;
    while (iVar11 = 0x386, iVar15 < *(int *)((long)plVar18 + 0x94)) {
      N_VScale(1.0,ycor,z);
      iVar15 = (**NLS->content)(ycor,x,mem);
      plVar18 = (long *)NLS->content;
      if (iVar15 != 0) break;
      uVar3 = *(uint *)(plVar18 + 2);
      lVar23 = (long)(int)uVar3;
      if (lVar23 == 0) {
LAB_004c147d:
        N_VScale(1.0,x,ycor);
      }
      else {
        nvec = *(uint *)(plVar18 + 0x12);
        piVar4 = (int *)plVar18[3];
        p_Var5 = (N_Vector)plVar18[0x10];
        y = (N_Vector)plVar18[0xf];
        lVar6 = plVar18[9];
        lVar7 = plVar18[10];
        Y = (N_Vector *)plVar18[0xb];
        c = (realtype *)plVar18[8];
        X = (N_Vector *)plVar18[0xc];
        pdVar8 = (double *)plVar18[6];
        dotprods = (realtype *)plVar18[7];
        z_01 = (N_Vector)plVar18[0x11];
        lVar9 = plVar18[4];
        dVar2 = (double)plVar18[5];
        uVar12 = 0;
        if (0 < (int)uVar3) {
          uVar12 = (ulong)uVar3;
        }
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          piVar4[uVar16] = 0;
        }
        uVar10 = nvec - 1;
        uVar12 = (long)(int)uVar10 % (long)(int)uVar3 & 0xffffffff;
        N_VLinearSum(1.0,x,-1.0,z,z_01);
        iVar11 = (int)((long)(int)uVar10 % (long)(int)uVar3);
        lVar21 = (long)iVar11;
        if (0 < (int)nvec) {
          N_VLinearSum(1.0,x,-1.0,p_Var5,*(N_Vector *)(lVar7 + lVar21 * 8));
          N_VLinearSum(1.0,z_01,-1.0,y,*(N_Vector *)(lVar6 + lVar21 * 8));
        }
        N_VScale(1.0,x,p_Var5);
        N_VScale(1.0,z_01,y);
        if (nvec == 1) {
          p_Var5 = *(N_Vector *)(lVar6 + uVar12 * 8);
          rVar24 = N_VDotProd(p_Var5,p_Var5);
          dVar27 = 0.0;
          if (0.0 < rVar24) {
            p_Var5 = *(N_Vector *)(lVar6 + uVar12 * 8);
            rVar24 = N_VDotProd(p_Var5,p_Var5);
            if (rVar24 < 0.0) {
              dVar27 = sqrt(rVar24);
            }
            else {
              dVar27 = SQRT(rVar24);
            }
          }
          *pdVar8 = dVar27;
          N_VScale(1.0 / dVar27,*(N_Vector *)(lVar6 + uVar12 * 8),Y[uVar12]);
          *piVar4 = 0;
        }
        else {
          if (nvec == 0) goto LAB_004c147d;
          if ((int)uVar3 < (int)nvec) {
            uVar10 = uVar3 - 1;
            uVar12 = 0;
            if (0 < (int)uVar10) {
              uVar12 = (ulong)uVar10;
            }
            iVar15 = 2;
            uVar16 = 0;
            pdVar22 = pdVar8;
            while (uVar16 != uVar12) {
              lVar13 = (long)iVar15;
              lVar17 = lVar23 * 8 * lVar13;
              uVar1 = uVar16 + 1;
              lVar19 = uVar1 * lVar23;
              auVar26 = *(undefined1 (*) [16])(pdVar8 + lVar19 + uVar16);
              dVar27 = auVar26._0_8_ * auVar26._0_8_ + auVar26._8_8_ * auVar26._8_8_;
              auVar28._0_8_ = (double)(-(ulong)(0.0 < dVar27) & (ulong)SQRT(dVar27));
              pdVar8[lVar19 + uVar16] = auVar28._0_8_;
              pdVar8[lVar19 + uVar16 + 1] = 0.0;
              auVar28._8_8_ = auVar28._0_8_;
              auVar26 = divpd(auVar26,auVar28);
              rVar24 = auVar26._0_8_;
              dVar27 = auVar26._8_8_;
              for (; lVar13 < lVar23; lVar13 = lVar13 + 1) {
                dVar25 = *(double *)((long)pdVar22 + lVar17 + 8);
                auVar29._8_8_ = *(double *)((long)pdVar22 + lVar17) * -dVar27 + dVar25 * rVar24;
                auVar29._0_8_ = *(double *)((long)pdVar22 + lVar17) * rVar24 + dVar25 * dVar27;
                *(undefined1 (*) [16])((long)pdVar22 + lVar17) = auVar29;
                lVar17 = lVar17 + lVar23 * 8;
              }
              N_VLinearSum(rVar24,Y[uVar16],dVar27,Y[uVar1],ycor);
              N_VLinearSum(-dVar27,Y[uVar16],rVar24,Y[uVar1],Y[uVar1]);
              N_VScale(1.0,ycor,Y[uVar16]);
              iVar15 = iVar15 + 1;
              pdVar22 = pdVar22 + 1;
              uVar16 = uVar1;
            }
            pdVar22 = pdVar8;
            for (lVar13 = 1; uVar16 = uVar12, pdVar20 = pdVar22, lVar13 < lVar23;
                lVar13 = lVar13 + 1) {
              while (uVar16 != 0) {
                *pdVar20 = pdVar20[lVar23];
                uVar16 = uVar16 - 1;
                pdVar20 = pdVar20 + 1;
              }
              pdVar22 = pdVar22 + lVar23;
            }
            N_VScale(1.0,*(N_Vector *)(lVar6 + lVar21 * 8),ycor);
            for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
              rVar24 = N_VDotProd(Y[uVar16],ycor);
              pdVar8[(long)(int)(uVar10 * uVar3) + uVar16] = rVar24;
              N_VLinearSum(1.0,ycor,-rVar24,Y[uVar16],ycor);
            }
            rVar24 = N_VDotProd(ycor,ycor);
            dVar27 = 0.0;
            if (0.0 < rVar24) {
              rVar24 = N_VDotProd(ycor,ycor);
              if (rVar24 < 0.0) {
                dVar27 = sqrt(rVar24);
              }
              else {
                dVar27 = SQRT(rVar24);
              }
            }
            pdVar8[(long)(int)(uVar3 * uVar3) + -1] = dVar27;
            N_VScale(1.0 / dVar27,ycor,Y[lVar23 + -1]);
            piVar14 = piVar4;
            for (lVar21 = 0; iVar15 = iVar11 + 1 + (int)lVar21, iVar15 < (int)uVar3;
                lVar21 = lVar21 + 1) {
              piVar4[lVar21] = iVar15;
              piVar14 = piVar14 + 1;
            }
            for (iVar15 = 0; iVar15 <= iVar11; iVar15 = iVar15 + 1) {
              *piVar14 = iVar15;
              piVar14 = piVar14 + 1;
            }
          }
          else {
            N_VScale(1.0,*(N_Vector *)(lVar6 + lVar21 * 8),ycor);
            uVar12 = 0;
            if (0 < (int)uVar10) {
              uVar12 = (ulong)uVar10;
            }
            for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
              piVar4[uVar16] = (int)uVar16;
              rVar24 = N_VDotProd(Y[uVar16],ycor);
              pdVar8[(long)(int)(uVar10 * uVar3) + uVar16] = rVar24;
              N_VLinearSum(1.0,ycor,-rVar24,Y[uVar16],ycor);
            }
            rVar24 = N_VDotProd(ycor,ycor);
            dVar27 = 0.0;
            if (0.0 < rVar24) {
              rVar24 = N_VDotProd(ycor,ycor);
              if (rVar24 < 0.0) {
                dVar27 = sqrt(rVar24);
              }
              else {
                dVar27 = SQRT(rVar24);
              }
            }
            pdVar8[(long)(int)(uVar10 * uVar3 + nvec) + -1] = dVar27;
            N_VScale((realtype)(~-(ulong)(dVar27 == 0.0) & (ulong)(1.0 / dVar27)),ycor,Y[lVar21]);
            piVar4[(int)uVar10] = uVar10;
          }
        }
        if ((int)uVar3 < (int)nvec) {
          nvec = uVar3;
        }
        iVar11 = N_VDotProdMulti(nvec,z_01,Y,dotprods);
        if (iVar11 == 0) {
          *c = 1.0;
          *X = x;
          uVar10 = nvec - 1;
          lVar13 = (long)(int)uVar10;
          lVar21 = lVar13 + 1;
          pdVar22 = pdVar8 + lVar21 * lVar23 + lVar13;
          uVar12 = 2;
          uVar16 = 1;
          for (; pdVar20 = pdVar22, lVar17 = lVar21, -1 < lVar13; lVar13 = lVar13 + -1) {
            for (; lVar17 < (int)nvec; lVar17 = lVar17 + 1) {
              dotprods[lVar13] = dotprods[lVar13] - *pdVar20 * dotprods[lVar17];
              pdVar20 = pdVar20 + lVar23;
            }
            dVar27 = dotprods[lVar13];
            dVar25 = 0.0;
            if ((dVar27 != 0.0) || (NAN(dVar27))) {
              dVar25 = dVar27 / pdVar8[(int)((uVar3 + 1) * (int)lVar13)];
            }
            dotprods[lVar13] = dVar25;
            c[uVar16] = -dVar25;
            X[uVar16] = *(N_Vector *)(lVar7 + (long)piVar4[lVar13] * 8);
            uVar16 = uVar16 + 1;
            lVar21 = lVar21 + -1;
            pdVar22 = (double *)((long)pdVar22 + (lVar23 * 8 ^ 0xfffffffffffffff8U));
            uVar12 = uVar12 + 1;
          }
          if ((int)lVar9 != 0) {
            c[uVar16 & 0xffffffff] = -(1.0 - dVar2);
            X[uVar16 & 0xffffffff] = z_01;
            for (; uVar16 = uVar12, -1 < (int)uVar10; uVar10 = uVar10 - 1) {
              c[uVar12] = dotprods[uVar10] * (1.0 - dVar2);
              X[uVar12] = *(N_Vector *)(lVar6 + (long)piVar4[uVar10] * 8);
              uVar12 = uVar12 + 1;
            }
          }
          N_VLinearCombination((int)uVar16,c,X,ycor);
        }
      }
      plVar18 = (long *)((long)NLS->content + 0x98);
      *plVar18 = *plVar18 + 1;
      N_VLinearSum(1.0,ycor,-1.0,z,z_00);
      iVar11 = (**(code **)((long)NLS->content + 8))
                         (tol,NLS,ycor,z_00,w,*(undefined8 *)((long)NLS->content + 0xa8));
      if (iVar11 != 0x385) {
        if (iVar11 == 0) {
          return 0;
        }
        plVar18 = (long *)NLS->content;
        break;
      }
      plVar18 = (long *)NLS->content;
      iVar15 = (int)plVar18[0x12] + 1;
      *(int *)(plVar18 + 0x12) = iVar15;
    }
    plVar18[0x14] = plVar18[0x14] + 1;
  }
  return iVar11;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector ycor, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print current iteration number and the nonlinear residual */
  if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
      && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
  {
    fprintf(FP_CONTENT(NLS)->info_file,
            "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
            (long int) FP_CONTENT(NLS)->niters);
  }
  SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNNonlinSolSolve_FixedPoint", "begin-iteration",
    "iter = %ld, nni = %ld", (long int) 0, FP_CONTENT(NLS)->niters);
#endif

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
        && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(FP_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
              (long int) FP_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_FixedPoint", "end-of-iterate",
      "iter = %ld, nni = %ld, wrmsnorm = %.16g",  (long int) FP_CONTENT(NLS)->curiter,
      FP_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}